

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_palette.cpp
# Opt level: O2

void Cmd_testblend(FCommandLine *argv,APlayerPawn *who,int key)

{
  int iVar1;
  uint uVar2;
  FScriptPosition *sc;
  FString *pFVar3;
  FString cstr;
  char *__nptr;
  double dVar4;
  float fVar5;
  FString colorstring;
  FString local_18;
  
  colorstring.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  iVar1 = FCommandLine::argc(argv);
  if (iVar1 < 3) {
    Printf("testblend <color> <amount>\n");
  }
  else {
    sc = (FScriptPosition *)FCommandLine::operator[](argv,1);
    V_GetColorStringByName((char *)&local_18,sc);
    pFVar3 = FString::operator=(&colorstring,&local_18);
    iVar1 = *(int *)(pFVar3->Chars + -0xc);
    FString::~FString(&local_18);
    cstr = colorstring;
    if (iVar1 == 0) {
      cstr.Chars = FCommandLine::operator[](argv,1);
    }
    uVar2 = V_GetColorFromString((DWORD *)0x0,cstr.Chars,(FScriptPosition *)0x0);
    __nptr = FCommandLine::operator[](argv,2);
    dVar4 = atof(__nptr);
    fVar5 = (float)dVar4;
    BaseBlendA = 1.0;
    if ((fVar5 <= 1.0) && (BaseBlendA = fVar5, fVar5 < 0.0)) {
      BaseBlendA = 0.0;
    }
    BaseBlendR = uVar2 >> 0x10 & 0xff;
    BaseBlendG = uVar2 >> 8 & 0xff;
    BaseBlendB = uVar2 & 0xff;
  }
  FString::~FString(&colorstring);
  return;
}

Assistant:

CCMD (testblend)
{
	FString colorstring;
	int color;
	float amt;

	if (argv.argc() < 3)
	{
		Printf ("testblend <color> <amount>\n");
	}
	else
	{
		if ( !(colorstring = V_GetColorStringByName (argv[1])).IsEmpty() )
		{
			color = V_GetColorFromString (NULL, colorstring);
		}
		else
		{
			color = V_GetColorFromString (NULL, argv[1]);
		}
		amt = (float)atof (argv[2]);
		if (amt > 1.0f)
			amt = 1.0f;
		else if (amt < 0.0f)
			amt = 0.0f;
		BaseBlendR = RPART(color);
		BaseBlendG = GPART(color);
		BaseBlendB = BPART(color);
		BaseBlendA = amt;
	}
}